

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallImportedRuntimeArtifactsGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallImportedRuntimeArtifactsGenerator::GenerateScriptForConfig
          (cmInstallImportedRuntimeArtifactsGenerator *this,ostream *os,string *config,Indent indent
          )

{
  bool bVar1;
  TargetType TVar2;
  RegularExpressionMatch *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  allocator_type local_309;
  string bundleName;
  string bundleDir;
  string bundlePath;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2a8;
  string local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string location;
  RegularExpressionMatch match;
  
  cmGeneratorTarget::GetFullPath(&location,this->Target,config,RuntimeBinaryArtifact,false);
  TVar2 = cmGeneratorTarget::GetType(this->Target);
  if (TVar2 == EXECUTABLE) {
    bVar1 = cmGeneratorTarget::IsBundleOnApple(this->Target);
    if (bVar1) {
      memset(&match,0,0x208);
      bVar1 = cmsys::RegularExpression::find
                        ((RegularExpression *)(anonymous_namespace)::BundleRegularExpression,
                         location._M_dataplus._M_p,&match);
      if (!bVar1) goto LAB_004707cb;
      cmsys::RegularExpressionMatch::match_abi_cxx11_(&bundleDir,&match,1);
      cmsys::RegularExpressionMatch::match_abi_cxx11_(&bundleName,&match,2);
      cmStrCat<std::__cxx11::string&,std::__cxx11::string&,char_const(&)[5]>
                (&bundlePath,&bundleDir,&bundleName,(char (*) [5])".app");
      GetDestination(&local_290,this,config);
      std::__cxx11::string::string((string *)&local_270,(string *)&bundlePath);
      __l_01._M_len = 1;
      __l_01._M_array = &local_270;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_2a8,__l_01,&local_309);
      cmInstallGenerator::AddInstallRule
                (&this->super_cmInstallGenerator,os,&local_290,cmInstallType_DIRECTORY,&local_2a8,
                 this->Optional,(char *)0x0,(this->FilePermissions)._M_dataplus._M_p,(char *)0x0,
                 " USE_SOURCE_PERMISSIONS",indent,(char *)0x0);
      goto LAB_004704f8;
    }
    GetDestination((string *)&match,this,config);
    std::__cxx11::string::string((string *)&bundleDir,(string *)&location);
    __l_03._M_len = 1;
    __l_03._M_array = &bundleDir;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&bundleName,__l_03,(allocator_type *)&bundlePath);
    cmInstallGenerator::AddInstallRule
              (&this->super_cmInstallGenerator,os,(string *)&match,cmInstallType_EXECUTABLE,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&bundleName,this->Optional,(this->FilePermissions)._M_dataplus._M_p,(char *)0x0,
               (char *)0x0,(char *)0x0,indent,(char *)0x0);
LAB_004707aa:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&bundleName);
    std::__cxx11::string::~string((string *)&bundleDir);
    this_00 = &match;
  }
  else {
    if (TVar2 == SHARED_LIBRARY) {
      bVar1 = cmGeneratorTarget::IsFrameworkOnApple(this->Target);
      if (!bVar1) {
        std::__cxx11::string::string((string *)&match,(string *)&location);
        __l_02._M_len = 1;
        __l_02._M_array = (iterator)&match;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&bundlePath,__l_02,(allocator_type *)&bundleDir);
        std::__cxx11::string::~string((string *)&match);
        cmGeneratorTarget::GetSOName((string *)&match,this->Target,config,RuntimeBinaryArtifact);
        cmGeneratorTarget::GetDirectory(&bundleName,this->Target,config,RuntimeBinaryArtifact);
        local_290._M_dataplus._M_p._0_1_ = 0x2f;
        cmStrCat<std::__cxx11::string,char,std::__cxx11::string&>
                  (&bundleDir,&bundleName,(char *)&local_290,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&match);
        std::__cxx11::string::~string((string *)&bundleName);
        if (match.startp[1] != (char *)0x0) {
          bVar1 = std::operator!=(&bundleDir,&location);
          if (bVar1) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&bundlePath,&bundleDir);
          }
        }
        GetDestination(&bundleName,this,config);
        cmInstallGenerator::AddInstallRule
                  (&this->super_cmInstallGenerator,os,&bundleName,cmInstallType_SHARED_LIBRARY,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&bundlePath,this->Optional,(this->FilePermissions)._M_dataplus._M_p,
                   (char *)0x0,(char *)0x0,(char *)0x0,indent,(char *)0x0);
        std::__cxx11::string::~string((string *)&bundleName);
        std::__cxx11::string::~string((string *)&bundleDir);
        std::__cxx11::string::~string((string *)&match);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&bundlePath);
        goto LAB_004707cb;
      }
      memset(&match,0,0x208);
      bVar1 = cmsys::RegularExpression::find
                        ((RegularExpression *)(anonymous_namespace)::FrameworkRegularExpression,
                         location._M_dataplus._M_p,&match);
      if (!bVar1) goto LAB_004707cb;
      cmsys::RegularExpressionMatch::match_abi_cxx11_(&bundleDir,&match,1);
      cmsys::RegularExpressionMatch::match_abi_cxx11_(&bundleName,&match,2);
      cmStrCat<std::__cxx11::string&,std::__cxx11::string&,char_const(&)[11]>
                (&bundlePath,&bundleDir,&bundleName,(char (*) [11])".framework");
      GetDestination(&local_290,this,config);
      std::__cxx11::string::string((string *)&local_270,(string *)&bundlePath);
      __l_00._M_len = 1;
      __l_00._M_array = &local_270;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_2a8,__l_00,&local_309);
      cmInstallGenerator::AddInstallRule
                (&this->super_cmInstallGenerator,os,&local_290,cmInstallType_DIRECTORY,&local_2a8,
                 this->Optional,(char *)0x0,(this->FilePermissions)._M_dataplus._M_p,(char *)0x0,
                 " USE_SOURCE_PERMISSIONS",indent,(char *)0x0);
    }
    else {
      if (TVar2 != MODULE_LIBRARY) {
        __assert_fail("false && \"This should never happen\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmInstallImportedRuntimeArtifactsGenerator.cxx"
                      ,0x8f,
                      "virtual void cmInstallImportedRuntimeArtifactsGenerator::GenerateScriptForConfig(std::ostream &, const std::string &, Indent)"
                     );
      }
      bVar1 = cmGeneratorTarget::IsCFBundleOnApple(this->Target);
      if (!bVar1) {
        GetDestination((string *)&match,this,config);
        std::__cxx11::string::string((string *)&bundleDir,(string *)&location);
        __l_04._M_len = 1;
        __l_04._M_array = &bundleDir;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&bundleName,__l_04,(allocator_type *)&bundlePath);
        cmInstallGenerator::AddInstallRule
                  (&this->super_cmInstallGenerator,os,(string *)&match,cmInstallType_MODULE_LIBRARY,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&bundleName,this->Optional,(this->FilePermissions)._M_dataplus._M_p,
                   (char *)0x0,(char *)0x0,(char *)0x0,indent,(char *)0x0);
        goto LAB_004707aa;
      }
      memset(&match,0,0x208);
      bVar1 = cmsys::RegularExpression::find
                        ((RegularExpression *)(anonymous_namespace)::CFBundleRegularExpression,
                         location._M_dataplus._M_p,&match);
      if (!bVar1) goto LAB_004707cb;
      cmsys::RegularExpressionMatch::match_abi_cxx11_(&bundleDir,&match,1);
      cmsys::RegularExpressionMatch::match_abi_cxx11_(&bundleName,&match,2);
      cmStrCat<std::__cxx11::string&,std::__cxx11::string&,char_const(&)[8]>
                (&bundlePath,&bundleDir,&bundleName,(char (*) [8])".bundle");
      GetDestination(&local_290,this,config);
      std::__cxx11::string::string((string *)&local_270,(string *)&bundlePath);
      __l._M_len = 1;
      __l._M_array = &local_270;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_2a8,__l,&local_309);
      cmInstallGenerator::AddInstallRule
                (&this->super_cmInstallGenerator,os,&local_290,cmInstallType_DIRECTORY,&local_2a8,
                 this->Optional,(char *)0x0,(this->FilePermissions)._M_dataplus._M_p,(char *)0x0,
                 " USE_SOURCE_PERMISSIONS",indent,(char *)0x0);
    }
LAB_004704f8:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2a8);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&bundlePath);
    std::__cxx11::string::~string((string *)&bundleName);
    this_00 = (RegularExpressionMatch *)&bundleDir;
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_004707cb:
  std::__cxx11::string::~string((string *)&location);
  return;
}

Assistant:

void cmInstallImportedRuntimeArtifactsGenerator::GenerateScriptForConfig(
  std::ostream& os, const std::string& config, Indent indent)
{
  auto location = this->Target->GetFullPath(config);

  switch (this->Target->GetType()) {
    case cmStateEnums::EXECUTABLE:
      if (this->Target->IsBundleOnApple()) {
        cmsys::RegularExpressionMatch match;
        if (BundleRegularExpression.find(location.c_str(), match)) {
          auto bundleDir = match.match(1);
          auto bundleName = match.match(2);
          auto bundlePath = cmStrCat(bundleDir, bundleName, ".app");
          this->AddInstallRule(os, this->GetDestination(config),
                               cmInstallType_DIRECTORY, { bundlePath },
                               this->Optional, nullptr,
                               this->FilePermissions.c_str(), nullptr,
                               " USE_SOURCE_PERMISSIONS", indent);
        }
      } else {
        this->AddInstallRule(os, this->GetDestination(config),
                             cmInstallType_EXECUTABLE, { location },
                             this->Optional, this->FilePermissions.c_str(),
                             nullptr, nullptr, nullptr, indent);
      }
      break;
    case cmStateEnums::SHARED_LIBRARY:
      if (this->Target->IsFrameworkOnApple()) {
        cmsys::RegularExpressionMatch match;
        if (FrameworkRegularExpression.find(location.c_str(), match)) {
          auto frameworkDir = match.match(1);
          auto frameworkName = match.match(2);
          auto frameworkPath =
            cmStrCat(frameworkDir, frameworkName, ".framework");
          this->AddInstallRule(os, this->GetDestination(config),
                               cmInstallType_DIRECTORY, { frameworkPath },
                               this->Optional, nullptr,
                               this->FilePermissions.c_str(), nullptr,
                               " USE_SOURCE_PERMISSIONS", indent);
        }
      } else {
        std::vector<std::string> files{ location };
        auto soName = this->Target->GetSOName(config);
        auto soNameFile =
          cmStrCat(this->Target->GetDirectory(config), '/', soName);
        if (!soName.empty() && soNameFile != location) {
          files.push_back(soNameFile);
        }
        this->AddInstallRule(os, this->GetDestination(config),
                             cmInstallType_SHARED_LIBRARY, files,
                             this->Optional, this->FilePermissions.c_str(),
                             nullptr, nullptr, nullptr, indent);
      }
      break;
    case cmStateEnums::MODULE_LIBRARY:
      if (this->Target->IsCFBundleOnApple()) {
        cmsys::RegularExpressionMatch match;
        if (CFBundleRegularExpression.find(location.c_str(), match)) {
          auto bundleDir = match.match(1);
          auto bundleName = match.match(2);
          auto bundlePath = cmStrCat(bundleDir, bundleName, ".bundle");
          this->AddInstallRule(os, this->GetDestination(config),
                               cmInstallType_DIRECTORY, { bundlePath },
                               this->Optional, nullptr,
                               this->FilePermissions.c_str(), nullptr,
                               " USE_SOURCE_PERMISSIONS", indent);
        }
      } else {
        this->AddInstallRule(os, this->GetDestination(config),
                             cmInstallType_MODULE_LIBRARY, { location },
                             this->Optional, this->FilePermissions.c_str(),
                             nullptr, nullptr, nullptr, indent);
      }
      break;
    default:
      assert(false && "This should never happen");
      break;
  }
}